

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_find_next_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_err_t iVar1;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *nkey;
  ion_bpp_external_address_t *piStack_28;
  ion_bpp_err_t rc;
  ion_bpp_external_address_t *rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  h = *(ion_bpp_h_node_t **)((long)handle + 0xa8);
  if (h == (ion_bpp_h_node_t *)0x0) {
    return bErrKeyNotFound;
  }
  piStack_28 = rec;
  rec_local = (ion_bpp_external_address_t *)key;
  key_local = handle;
  if (*(ion_bpp_comparison_t *)((long)handle + 0xb0) ==
      h->comp + (long)(int)(((*(ushort *)h->comp >> 1) - 1) * *(int *)((long)handle + 0xbc)) + 0x20)
  {
    if (*(long *)(h->comp + 0x10) == 0) {
      return bErrKeyNotFound;
    }
    iVar1 = readDisk(handle,*(ion_bpp_address_t *)(h->comp + 0x10),(ion_bpp_buffer_t **)&h);
    if (iVar1 != bErrOk) {
      return iVar1;
    }
    buf = (ion_bpp_buffer_t *)(h->comp + 0x20);
    nkey._4_4_ = 0;
  }
  else {
    buf = (ion_bpp_buffer_t *)(*(long *)((long)handle + 0xb0) + (long)*(int *)((long)handle + 0xbc))
    ;
  }
  memcpy(rec_local,buf,(long)*(int *)((long)handle + 8));
  *piStack_28 = *(ion_bpp_external_address_t *)((long)&buf->next + (long)*(int *)((long)handle + 8))
  ;
  *(ion_bpp_h_node_t **)((long)handle + 0xa8) = h;
  *(ion_bpp_buffer_t **)((long)handle + 0xb0) = buf;
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_find_next_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_key_t		*nkey;			/* next key */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	if ((buf = h->curBuf) == NULL) {
		return bErrKeyNotFound;
	}

	if (h->curKey == lkey(buf)) {
		/* current key is last key in leaf node */
		if (next(buf)) {
			/* fetch next set */
			if ((rc = readDisk(handle, next(buf), &buf)) != 0) {
				return rc;
			}

			nkey = fkey(buf);
		}
		else {
			/* no more sets */
			return bErrKeyNotFound;
		}
	}
	else {
		/* bump to next key */
		nkey = h->curKey + ks(1);
	}

	memcpy(key, key(nkey), h->keySize);
	*rec		= rec(nkey);
	h->curBuf	= buf;
	h->curKey	= nkey;
	return bErrOk;
}